

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

bool tchecker::zg::shared_is_le(state_t *s1,state_t *s2)

{
  bool bVar1;
  bool bVar2;
  zone_t *this;
  zone_t *zone;
  bool local_48;
  bool local_46;
  undefined1 local_38 [24];
  state_t *local_20;
  state_t *s2_local;
  state_t *s1_local;
  
  local_20 = s2;
  s2_local = s1;
  bVar2 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  local_38[0xf] = 0;
  bVar1 = false;
  local_46 = false;
  if (bVar2) {
    state_t::zone_ptr((state_t *)(local_38 + 0x10));
    local_38[0xf] = 1;
    state_t::zone_ptr((state_t *)local_38);
    bVar1 = true;
    bVar2 = tchecker::operator==
                      ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                        *)(local_38 + 0x10),
                       (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                        *)local_38);
    local_48 = true;
    if (!bVar2) {
      this = state_t::zone(s2_local);
      zone = state_t::zone(local_20);
      local_48 = zone_t::operator<=(this,zone);
    }
    local_46 = local_48;
  }
  s1_local._7_1_ = local_46;
  if (bVar1) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)local_38);
  }
  if ((local_38[0xf] & 1) != 0) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)(local_38 + 0x10));
  }
  return (bool)(s1_local._7_1_ & 1);
}

Assistant:

bool shared_is_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone() <= s2.zone());
}